

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O3

bool __thiscall
cmArchiveWrite::AddPath(cmArchiveWrite *this,char *path,size_t skip,char *prefix,bool recursive)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Status SVar5;
  unsigned_long uVar6;
  char *pcVar7;
  undefined8 uVar8;
  unsigned_long dindex;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  Directory d;
  string next;
  Directory DStack_c8;
  string local_c0;
  char *local_a0;
  string local_98;
  string local_60;
  undefined1 *local_40;
  undefined8 local_38;
  
  if ((*path == '.') && (path[1] == '\0')) {
    iVar4 = std::__cxx11::string::compare((char *)&this->Format);
    if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&this->Format), iVar4 == 0))
    goto LAB_00120f70;
  }
  bVar2 = AddFile(this,path,skip,prefix);
  if (!bVar2) {
    return false;
  }
LAB_00120f70:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,path,(allocator<char> *)&local_c0);
  bVar2 = cmsys::SystemTools::FileIsDirectory(&local_98);
  bVar3 = true;
  if (bVar2 && recursive) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,path,(allocator<char> *)&DStack_c8);
    bVar3 = cmsys::SystemTools::FileIsSymlink(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  local_a0 = prefix;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,(ulong)(local_98.field_2._M_allocated_capacity + 1));
  }
  bVar2 = true;
  if (bVar3 == false) {
    cmsys::Directory::Directory(&DStack_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,path,(allocator<char> *)&local_60);
    SVar5 = cmsys::Directory::Load(&DStack_c8,&local_98,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,(ulong)(local_98.field_2._M_allocated_capacity + 1))
      ;
    }
    bVar2 = true;
    if (SVar5.Kind_ == Success) {
      local_60._M_dataplus._M_p = (pointer)strlen(path);
      local_60.field_2._M_allocated_capacity = 0;
      local_98.field_2._M_allocated_capacity = (long)&local_98.field_2 + 8;
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 1;
      local_98.field_2._M_local_buf[8] = '/';
      local_60.field_2._8_8_ = 1;
      local_38 = 0;
      views._M_len = 2;
      views._M_array = (iterator)&local_60;
      local_60._M_string_length = (size_type)path;
      local_40 = (undefined1 *)local_98.field_2._M_allocated_capacity;
      cmCatViews(&local_c0,views);
      iVar4 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((char *)&this->Format);
        if ((iVar4 == 0) ||
           (iVar4 = std::__cxx11::string::compare((char *)&this->Format), iVar4 == 0)) {
          local_c0._M_string_length = 0;
          *local_c0._M_dataplus._M_p = '\0';
        }
      }
      sVar1 = local_c0._M_string_length;
      uVar6 = cmsys::Directory::GetNumberOfFiles(&DStack_c8);
      if (uVar6 != 0) {
        dindex = 0;
        do {
          pcVar7 = cmsys::Directory::GetFile(&DStack_c8,dindex);
          if ((*pcVar7 != '.') ||
             ((pcVar7[1] != '\0' && ((pcVar7[1] != '.' || (pcVar7[2] != '\0')))))) {
            if (local_c0._M_string_length < sVar1) {
              uVar8 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                 "basic_string::erase",sVar1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              cmsys::Directory::~Directory(&DStack_c8);
              _Unwind_Resume(uVar8);
            }
            local_c0._M_dataplus._M_p[sVar1] = '\0';
            local_c0._M_string_length = sVar1;
            std::__cxx11::string::append((char *)&local_c0);
            bVar3 = AddPath(this,local_c0._M_dataplus._M_p,skip,local_a0,true);
            if (!bVar3) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              bVar2 = false;
              goto LAB_001211e1;
            }
          }
          dindex = dindex + 1;
        } while (uVar6 != dindex);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
LAB_001211e1:
    cmsys::Directory::~Directory(&DStack_c8);
  }
  return bVar2;
}

Assistant:

bool cmArchiveWrite::AddPath(const char* path, size_t skip, const char* prefix,
                             bool recursive)
{
  if (strcmp(path, ".") != 0 ||
      (this->Format != "zip" && this->Format != "7zip")) {
    if (!this->AddFile(path, skip, prefix)) {
      return false;
    }
  }
  if ((!cmSystemTools::FileIsDirectory(path) || !recursive) ||
      cmSystemTools::FileIsSymlink(path)) {
    return true;
  }
  cmsys::Directory d;
  if (d.Load(path)) {
    std::string next = cmStrCat(path, '/');
    if (next == "./" && (this->Format == "zip" || this->Format == "7zip")) {
      next.clear();
    }
    std::string::size_type end = next.size();
    unsigned long n = d.GetNumberOfFiles();
    for (unsigned long i = 0; i < n; ++i) {
      const char* file = d.GetFile(i);
      if (strcmp(file, ".") != 0 && strcmp(file, "..") != 0) {
        next.erase(end);
        next += file;
        if (!this->AddPath(next.c_str(), skip, prefix)) {
          return false;
        }
      }
    }
  }
  return true;
}